

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atcp.c
# Opt level: O0

void nn_atcp_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_epbase *self_00;
  int errnum;
  nn_fsm *local_40;
  size_t local_38;
  size_t sz;
  nn_fsm *pnStack_28;
  int val;
  nn_atcp *atcp;
  void *srcptr_local;
  int type_local;
  int src_local;
  nn_fsm *self_local;
  
  local_40 = self;
  if (self == (nn_fsm *)0x0) {
    local_40 = (nn_fsm *)0x0;
  }
  pnStack_28 = local_40;
  atcp = (nn_atcp *)srcptr;
  srcptr_local._0_4_ = type;
  srcptr_local._4_4_ = src;
  _type_local = self;
  switch(*(undefined4 *)&local_40[1].fn) {
  case 1:
    if (src != -2) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)&local_40[1].fn,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/atcp.c"
              ,0xa9);
      fflush(_stderr);
      nn_err_abort();
    }
    if (type != -2) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)&local_40[1].fn,0xfffffffe,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/atcp.c"
              ,0xa5);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_usock_accept((nn_usock *)&local_40[1].state,(nn_usock *)local_40[8].srcptr);
    *(undefined4 *)&pnStack_28[1].fn = 2;
    break;
  case 2:
    if (src == 1) {
      if (type != 2) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)&local_40[1].fn,1,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/atcp.c"
                ,0xd8);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_epbase_clear_error((nn_epbase *)local_40[1].shutdown_fn);
      local_38 = 4;
      nn_epbase_getopt((nn_epbase *)pnStack_28[1].shutdown_fn,0,2,(void *)((long)&sz + 4),&local_38)
      ;
      if (local_38 != 4) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (val)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/atcp.c"
                ,0xbc);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_usock_setsockopt((nn_usock *)&pnStack_28[1].state,1,7,(void *)((long)&sz + 4),4);
      local_38 = 4;
      nn_epbase_getopt((nn_epbase *)pnStack_28[1].shutdown_fn,0,3,(void *)((long)&sz + 4),&local_38)
      ;
      if (local_38 != 4) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (val)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/atcp.c"
                ,0xc2);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_usock_setsockopt((nn_usock *)&pnStack_28[1].state,1,8,(void *)((long)&sz + 4),4);
      nn_usock_swap_owner((nn_usock *)pnStack_28[8].srcptr,(nn_fsm_owner *)&pnStack_28[8].owner);
      pnStack_28[8].srcptr = (void *)0x0;
      *(undefined4 *)&pnStack_28[8].owner = 0xffffffff;
      pnStack_28[8].ctx = (nn_ctx *)0x0;
      nn_fsm_raise(pnStack_28,(nn_fsm_event *)(pnStack_28 + 0x14),0x85b7);
      nn_usock_activate((nn_usock *)&pnStack_28[1].state);
      nn_stcp_start((nn_stcp *)&pnStack_28[8].stopped,(nn_usock *)&pnStack_28[1].state);
      *(undefined4 *)&pnStack_28[1].fn = 3;
      nn_epbase_stat_increment((nn_epbase *)pnStack_28[1].shutdown_fn,0x66,1);
    }
    else {
      if (src != 3) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
                (ulong)*(uint *)&local_40[1].fn,(ulong)(uint)src,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/atcp.c"
                ,0xeb);
        fflush(_stderr);
        nn_err_abort();
      }
      if (type != 6) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)&local_40[1].fn,3,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/atcp.c"
                ,0xe7);
        fflush(_stderr);
        nn_err_abort();
      }
      self_00 = (nn_epbase *)local_40[1].shutdown_fn;
      errnum = nn_usock_geterrno((nn_usock *)local_40[8].srcptr);
      nn_epbase_set_error(self_00,errnum);
      nn_epbase_stat_increment((nn_epbase *)pnStack_28[1].shutdown_fn,0x6b,1);
      nn_usock_accept((nn_usock *)&pnStack_28[1].state,(nn_usock *)pnStack_28[8].srcptr);
    }
    break;
  case 3:
    if (src != 2) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)&local_40[1].fn,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/atcp.c"
              ,0x101);
      fflush(_stderr);
      nn_err_abort();
    }
    if (type != 1) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)&local_40[1].fn,2,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/atcp.c"
              ,0xfd);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_stcp_stop((nn_stcp *)&local_40[8].stopped);
    *(undefined4 *)&pnStack_28[1].fn = 4;
    nn_epbase_stat_increment((nn_epbase *)pnStack_28[1].shutdown_fn,0x68,1);
    break;
  case 4:
    if (src != 2) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)&local_40[1].fn,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/atcp.c"
              ,0x117);
      fflush(_stderr);
      nn_err_abort();
    }
    if (type == 2) {
      nn_usock_stop((nn_usock *)&local_40[1].state);
      *(undefined4 *)&pnStack_28[1].fn = 5;
    }
    else if (type != 8) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)&local_40[1].fn,2,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/atcp.c"
              ,0x113);
      fflush(_stderr);
      nn_err_abort();
    }
    break;
  case 5:
    if (src != 1) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)&local_40[1].fn,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/atcp.c"
              ,0x12d);
      fflush(_stderr);
      nn_err_abort();
    }
    if (type == 7) {
      nn_fsm_raise(local_40,(nn_fsm_event *)&local_40[0x14].ctx,0x85b8);
      *(undefined4 *)&pnStack_28[1].fn = 6;
    }
    else if (type != 8) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)&local_40[1].fn,1,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/atcp.c"
              ,0x129);
      fflush(_stderr);
      nn_err_abort();
    }
    break;
  default:
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
            (ulong)*(uint *)&local_40[1].fn,(ulong)(uint)src,(ulong)(uint)type,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/atcp.c"
            ,0x134);
    fflush(_stderr);
    nn_err_abort();
  }
  return;
}

Assistant:

static void nn_atcp_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_atcp *atcp;
    int val;
    size_t sz;

    atcp = nn_cont (self, struct nn_atcp, fsm);

    switch (atcp->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/*  The state machine wasn't yet started.                                     */
/******************************************************************************/
    case NN_ATCP_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_usock_accept (&atcp->usock, atcp->listener);
                atcp->state = NN_ATCP_STATE_ACCEPTING;
                return;
            default:
                nn_fsm_bad_action (atcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (atcp->state, src, type);
        }

/******************************************************************************/
/*  ACCEPTING state.                                                          */
/*  Waiting for incoming connection.                                          */
/******************************************************************************/
    case NN_ATCP_STATE_ACCEPTING:
        switch (src) {

        case NN_ATCP_SRC_USOCK:
            switch (type) {
            case NN_USOCK_ACCEPTED:
                nn_epbase_clear_error (atcp->epbase);

                /*  Set the relevant socket options. */
                sz = sizeof (val);
                nn_epbase_getopt (atcp->epbase, NN_SOL_SOCKET, NN_SNDBUF,
                    &val, &sz);
                nn_assert (sz == sizeof (val));
                nn_usock_setsockopt (&atcp->usock, SOL_SOCKET, SO_SNDBUF,
                    &val, sizeof (val));
                sz = sizeof (val);
                nn_epbase_getopt (atcp->epbase, NN_SOL_SOCKET, NN_RCVBUF,
                    &val, &sz);
                nn_assert (sz == sizeof (val));
                nn_usock_setsockopt (&atcp->usock, SOL_SOCKET, SO_RCVBUF,
                    &val, sizeof (val));

                /*  Return ownership of the listening socket to the parent. */
                nn_usock_swap_owner (atcp->listener, &atcp->listener_owner);
                atcp->listener = NULL;
                atcp->listener_owner.src = -1;
                atcp->listener_owner.fsm = NULL;
                nn_fsm_raise (&atcp->fsm, &atcp->accepted, NN_ATCP_ACCEPTED);

                /*  Start the stcp state machine. */
                nn_usock_activate (&atcp->usock);
                nn_stcp_start (&atcp->stcp, &atcp->usock);
                atcp->state = NN_ATCP_STATE_ACTIVE;

                nn_epbase_stat_increment (atcp->epbase,
                    NN_STAT_ACCEPTED_CONNECTIONS, 1);

                return;

            default:
                nn_fsm_bad_action (atcp->state, src, type);
            }

        case NN_ATCP_SRC_LISTENER:
            switch (type) {

            case NN_USOCK_ACCEPT_ERROR:
                nn_epbase_set_error (atcp->epbase,
                    nn_usock_geterrno(atcp->listener));
                nn_epbase_stat_increment (atcp->epbase,
                    NN_STAT_ACCEPT_ERRORS, 1);
                nn_usock_accept (&atcp->usock, atcp->listener);
                return;

            default:
                nn_fsm_bad_action (atcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (atcp->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_ATCP_STATE_ACTIVE:
        switch (src) {

        case NN_ATCP_SRC_STCP:
            switch (type) {
            case NN_STCP_ERROR:
                nn_stcp_stop (&atcp->stcp);
                atcp->state = NN_ATCP_STATE_STOPPING_STCP;
                nn_epbase_stat_increment (atcp->epbase,
                    NN_STAT_BROKEN_CONNECTIONS, 1);
                return;
            default:
                nn_fsm_bad_action (atcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (atcp->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_STCP state.                                                      */
/******************************************************************************/
    case NN_ATCP_STATE_STOPPING_STCP:
        switch (src) {

        case NN_ATCP_SRC_STCP:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_STCP_STOPPED:
                nn_usock_stop (&atcp->usock);
                atcp->state = NN_ATCP_STATE_STOPPING_USOCK;
                return;
            default:
                nn_fsm_bad_action (atcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (atcp->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_USOCK state.                                                      */
/******************************************************************************/
    case NN_ATCP_STATE_STOPPING_USOCK:
        switch (src) {

        case NN_ATCP_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_USOCK_STOPPED:
                nn_fsm_raise (&atcp->fsm, &atcp->done, NN_ATCP_ERROR);
                atcp->state = NN_ATCP_STATE_DONE;
                return;
            default:
                nn_fsm_bad_action (atcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (atcp->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (atcp->state, src, type);
    }
}